

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

int tcu::astc::anon_unknown_0::computeNumColorEndpointValues
              (deUint32 *endpointModes,int numPartitions,bool isMultiPartSingleCemMode)

{
  int iVar1;
  int local_28;
  int local_24;
  int i;
  int result;
  bool isMultiPartSingleCemMode_local;
  int numPartitions_local;
  deUint32 *endpointModes_local;
  
  if (isMultiPartSingleCemMode) {
    iVar1 = computeNumColorEndpointValues(*endpointModes);
    endpointModes_local._4_4_ = numPartitions * iVar1;
  }
  else {
    local_24 = 0;
    for (local_28 = 0; local_28 < numPartitions; local_28 = local_28 + 1) {
      iVar1 = computeNumColorEndpointValues(endpointModes[local_28]);
      local_24 = iVar1 + local_24;
    }
    endpointModes_local._4_4_ = local_24;
  }
  return endpointModes_local._4_4_;
}

Assistant:

static inline int computeNumColorEndpointValues (const deUint32* endpointModes, int numPartitions, bool isMultiPartSingleCemMode)
{
	if (isMultiPartSingleCemMode)
		return numPartitions * computeNumColorEndpointValues(endpointModes[0]);
	else
	{
		int result = 0;
		for (int i = 0; i < numPartitions; i++)
			result += computeNumColorEndpointValues(endpointModes[i]);
		return result;
	}
}